

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcColourRgb::~IfcColourRgb(IfcColourRgb *this)

{
  long *plVar1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_IfcColourSpecification).
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>.
           _vptr_ObjectHelper[-3];
  plVar1 = (long *)(&(this->super_IfcColourSpecification).
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>.
                     field_0x20 + (long)p_Var2);
  plVar1[-4] = 0x8415c0;
  plVar1[8] = 0x8415e8;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  operator_delete((_func_int *)
                  ((long)&(this->super_IfcColourSpecification).
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>.
                          _vptr_ObjectHelper + (long)p_Var2),0x78);
  return;
}

Assistant:

IfcColourRgb() : Object("IfcColourRgb") {}